

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::ParseableFunctionInfo::CleanupToReparse(ParseableFunctionInfo *this)

{
  byte *pbVar1;
  NestedArray *pNVar2;
  FunctionProxy *this_00;
  FunctionInfo *pFVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  ParseableFunctionInfo *this_01;
  ulong uVar7;
  
  bVar5 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
  if (bVar5) {
    bVar5 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar5) goto LAB_0076c65f;
      *puVar6 = 0;
    }
    pbVar1 = (byte *)((long)&this[1].super_FunctionProxy.super_FinalizableObject.
                             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 1);
    *pbVar1 = *pbVar1 & 0xfe;
  }
  pNVar2 = (this->nestedArray).ptr;
  if ((pNVar2 != (NestedArray *)0x0) && (pNVar2->nestedCount != 0)) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar7 = 0;
    do {
      this_00 = *(FunctionProxy **)((long)pNVar2[uVar7 + 1] + 8);
      if (this_00 != (FunctionProxy *)0x0) {
        if ((this_00->functionInfo).ptr == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x561,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar5) goto LAB_0076c65f;
          *puVar6 = 0;
        }
        if ((((this_00->functionInfo).ptr)->functionBodyImpl).ptr != this_00) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                      ,0x562,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                      "GetFunctionInfo()->GetFunctionProxy() == this");
          if (!bVar5) goto LAB_0076c65f;
          *puVar6 = 0;
        }
        pFVar3 = (this_00->functionInfo).ptr;
        if (((pFVar3->attributes & CanDefer) == None) || (pFVar3->compileCount == 0)) {
          bVar5 = FunctionProxy::IsFunctionBody(this_00);
          if (!bVar5) goto LAB_0076c5b5;
        }
        this_01 = FunctionProxy::GetParseableFunctionInfo(this_00);
        CleanupToReparse(this_01);
      }
LAB_0076c5b5:
      uVar7 = uVar7 + 1;
    } while (uVar7 < pNVar2->nestedCount);
  }
  CleanupToReparseHelper(this);
  bVar5 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
  if (!bVar5) {
    return;
  }
  bVar5 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (!bVar5) {
LAB_0076c65f:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  FunctionBody::CleanupToReparseHelper((FunctionBody *)this);
  return;
}

Assistant:

void ParseableFunctionInfo::CleanupToReparse()
    {
#if DBG
        if (this->IsFunctionBody())
        {
            GetFunctionBody()->UnlockCounters();
        }
#endif
        // The current function is already compiled. In order to prep this function to ready for debug mode, most of the previous information need to be thrown away.
        // Clean up the nested functions
        this->ForEachNestedFunc([&](FunctionProxy* proxy, uint32 index)
        {
            // Note: redeferred functions may have fully compiled children. If we find a redeferred function, keep walking.
            if (proxy && ((proxy->CanBeDeferred() && proxy->GetFunctionInfo()->GetCompileCount() > 0) || proxy->IsFunctionBody()))
            {
                proxy->GetParseableFunctionInfo()->CleanupToReparse();
            }
            return true;
        });

        this->CleanupToReparseHelper();
        if (this->IsFunctionBody())
        {
            this->GetFunctionBody()->CleanupToReparseHelper();
        }
    }